

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::remove
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,char *__filename)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  KeyVal *pKVar4;
  int in_EDX;
  long lVar5;
  Dic<asl::String> *this_00;
  
  pKVar4 = this->_a;
  iVar2 = *(int *)((long)&pKVar4[-1].key.field_2 + 8);
  iVar3 = (int)__filename;
  if (in_EDX + iVar3 <= iVar2) {
    if (in_EDX != 0) {
      lVar5 = (long)in_EDX << 5;
      this_00 = &pKVar4[iVar3].value;
      do {
        Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
                  ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this_00);
        if ((((KeyVal *)(this_00 + -3))->key)._size != 0) {
          ::free(((anon_union_16_2_78e7fdac_for_String_2 *)(this_00 + -2))->_str);
        }
        this_00 = this_00 + 4;
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != 0);
      pKVar4 = this->_a;
    }
    memmove(pKVar4 + iVar3,pKVar4 + iVar3 + in_EDX,(long)(iVar2 - (in_EDX + iVar3)) << 5);
    piVar1 = (int *)((long)&this->_a[-1].key.field_2 + 8);
    *piVar1 = *piVar1 - in_EDX;
    resize(this,iVar2 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}